

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> *
queryfromhashmap(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
                vector<int,_std::allocator<int>_> *qu,int offset,int d,int treeid)

{
  reference pvVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  iterator iVar5;
  int local_74;
  int i_1;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  point f;
  int treeid_local;
  int d_local;
  int offset_local;
  vector<int,_std::allocator<int>_> *qu_local;
  set<int,_std::less<int>,_std::allocator<int>_> *cnt;
  
  f.d._3_1_ = 0;
  f._28_4_ = treeid;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__);
  point::point((point *)local_48);
  f.f.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = PAA_DIMENSION[d];
  for (local_4c = 0; local_4c < PAA_DIMENSION[d]; local_4c = local_4c + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](qu,(long)(offset + local_4c));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_48,pvVar1);
  }
  sVar2 = std::
          map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::count(tree[d] + (int)f._28_4_,(key_type *)local_48);
  if (sVar2 != 0) {
    pmVar3 = std::
             map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](tree[d] + (int)f._28_4_,(key_type *)local_48);
    iVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pmVar3);
    pmVar3 = std::
             map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::operator[](tree[d] + (int)f._28_4_,(key_type *)local_48);
    iVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(pmVar3);
    std::set<int,std::less<int>,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>>
              ((set<int,std::less<int>,std::allocator<int>> *)__return_storage_ptr__,
               (_Rb_tree_const_iterator<int>)iVar4._M_node,
               (_Rb_tree_const_iterator<int>)iVar5._M_node);
  }
  for (local_74 = 0; local_74 < PAA_DIMENSION[d]; local_74 = local_74 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)local_74);
    *pvVar1 = *pvVar1 + -1;
    sVar2 = std::
            map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::count(tree[d] + (int)f._28_4_,(key_type *)local_48);
    if (sVar2 != 0) {
      pmVar3 = std::
               map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](tree[d] + (int)f._28_4_,(key_type *)local_48);
      iVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pmVar3);
      pmVar3 = std::
               map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](tree[d] + (int)f._28_4_,(key_type *)local_48);
      iVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(pmVar3);
      std::set<int,std::less<int>,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>>
                ((set<int,std::less<int>,std::allocator<int>> *)__return_storage_ptr__,
                 (_Rb_tree_const_iterator<int>)iVar4._M_node,
                 (_Rb_tree_const_iterator<int>)iVar5._M_node);
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)local_74);
    *pvVar1 = *pvVar1 + 2;
    sVar2 = std::
            map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::count(tree[d] + (int)f._28_4_,(key_type *)local_48);
    if (sVar2 != 0) {
      pmVar3 = std::
               map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](tree[d] + (int)f._28_4_,(key_type *)local_48);
      iVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pmVar3);
      pmVar3 = std::
               map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](tree[d] + (int)f._28_4_,(key_type *)local_48);
      iVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(pmVar3);
      std::set<int,std::less<int>,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>>
                ((set<int,std::less<int>,std::allocator<int>> *)__return_storage_ptr__,
                 (_Rb_tree_const_iterator<int>)iVar4._M_node,
                 (_Rb_tree_const_iterator<int>)iVar5._M_node);
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,(long)local_74);
    *pvVar1 = *pvVar1 + -1;
  }
  f.d._3_1_ = 1;
  point::~point((point *)local_48);
  if ((f.d._3_1_ & 1) == 0) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

set<int> queryfromhashmap(vector<int> &qu, int offset, int d, int treeid) {
    set<int> cnt;
    point f;
    f.d = PAA_DIMENSION[d];
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f.push_back(qu[offset + i]);
    }
    if (tree[d][treeid].count(f)) {
        cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
    }
    for (int i = 0; i < PAA_DIMENSION[d]; ++i) {
        f.f[i] -= 1;
        if (tree[d][treeid].count(f)) {
            cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
        }
        f.f[i] += 2;
        if (tree[d][treeid].count(f)) {
            cnt.insert(tree[d][treeid][f].begin(), tree[d][treeid][f].end());
        }
        f.f[i] -= 1;
    }
    return cnt;
}